

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcxtexture.cpp
# Opt level: O2

FTexture * PCXTexture_TryCreate(FileReader *file,int lumpnum)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  FPCXTexture *this;
  PCXHeader local_a0;
  
  (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
  iVar2 = (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_a0,0x80);
  if (CONCAT44(extraout_var,iVar2) != 0x80) {
    return (FTexture *)0x0;
  }
  if (local_a0.manufacturer != '\n') {
    return (FTexture *)0x0;
  }
  if (local_a0.encoding != '\x01') {
    return (FTexture *)0x0;
  }
  if (local_a0.version < 6) {
    if (local_a0.version == 1) {
      return (FTexture *)0x0;
    }
    if (local_a0.bitsPerPixel == '\b') {
      if (((uint)local_a0.xmax - (uint)local_a0.xmin & 0xfffffffe) + 2 !=
          (uint)local_a0.bytesPerScanLine) {
        return (FTexture *)0x0;
      }
    }
    else if ((local_a0.bitsPerPixel != '\x01') ||
            ((local_a0.numColorPlanes != '\x01' && (local_a0.numColorPlanes != '\x04')))) {
      return (FTexture *)0x0;
    }
    lVar3 = 0x4a;
    do {
      if (lVar3 == 0x80) {
        (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
        (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&local_a0,0x80);
        this = (FPCXTexture *)operator_new(0x68);
        FPCXTexture::FPCXTexture(this,lumpnum,&local_a0);
        return &this->super_FTexture;
      }
      lVar1 = lVar3 + -0x10;
      lVar3 = lVar3 + 1;
    } while (local_a0.palette[lVar1] == '\0');
    return (FTexture *)0x0;
  }
  return (FTexture *)0x0;
}

Assistant:

FTexture * PCXTexture_TryCreate(FileReader & file, int lumpnum)
{
	PCXHeader hdr;

	file.Seek(0, SEEK_SET);
	if (file.Read(&hdr, sizeof(hdr)) != sizeof(hdr))
	{
		return NULL;
	}

	hdr.xmin = LittleShort(hdr.xmin);
	hdr.xmax = LittleShort(hdr.xmax);
	hdr.bytesPerScanLine = LittleShort(hdr.bytesPerScanLine);

	if (hdr.manufacturer != 10 || hdr.encoding != 1) return NULL;
	if (hdr.version != 0 && hdr.version != 2 && hdr.version != 3 && hdr.version != 4 && hdr.version != 5) return NULL;
	if (hdr.bitsPerPixel != 1 && hdr.bitsPerPixel != 8) return NULL; 
	if (hdr.bitsPerPixel == 1 && hdr.numColorPlanes !=1 && hdr.numColorPlanes != 4) return NULL;
	if (hdr.bitsPerPixel == 8 && hdr.bytesPerScanLine != ((hdr.xmax - hdr.xmin + 2)&~1)) return NULL;

	for (int i = 0; i < 54; i++) 
	{
		if (hdr.padding[i] != 0) return NULL;
	}

	file.Seek(0, SEEK_SET);
	file.Read(&hdr, sizeof(hdr));

	return new FPCXTexture(lumpnum, hdr);
}